

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void P_GunShot(AActor *mo,bool accurate,PClassActor *pufftype,DAngle *pitch)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000031;
  FName local_3c;
  DAngle local_38;
  DAngle local_30;
  
  iVar1 = FRandom::operator()(&pr_gunshot);
  local_30.Degrees = (mo->Angles).Yaw.Degrees;
  if ((int)CONCAT71(in_register_00000031,accurate) == 0) {
    iVar2 = FRandom::Random2(&pr_gunshot);
    local_30.Degrees = local_30.Degrees + (double)iVar2 * 0.02197265625;
  }
  local_38 = (DAngle)pitch->Degrees;
  local_3c.Index = 200;
  P_LineAttack(mo,&local_30,8192.0,&local_38,(iVar1 % 3) * 5 + 5,&local_3c,pufftype,0,
               (FTranslatedLineTarget *)0x0,(int *)0x0);
  return;
}

Assistant:

void P_GunShot (AActor *mo, bool accurate, PClassActor *pufftype, DAngle pitch)
{
	DAngle 	angle;
	int 		damage;
		
	damage = 5*(pr_gunshot()%3+1);
	angle = mo->Angles.Yaw;

	if (!accurate)
	{
		angle += pr_gunshot.Random2 () * (5.625 / 256);
	}

	P_LineAttack (mo, angle, PLAYERMISSILERANGE, pitch, damage, NAME_Hitscan, pufftype);
}